

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpConnection.c
# Opt level: O0

sbfTcpConnection_conflict
sbfTcpConnection_wrap
          (sbfLog log,int socket,int isUnix,int disableNagles,sbfTcpConnectionAddress *address)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  sbfLog in_RDI;
  void *in_R8;
  int result;
  int flag;
  sbfTcpConnection_conflict tc;
  undefined4 local_2c;
  sbfTcpConnection_conflict local_28;
  void *local_20;
  int local_14;
  int local_10;
  int local_c;
  sbfLog local_8;
  
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  evutil_make_socket_closeonexec(in_ESI);
  evutil_make_socket_nonblocking(local_c);
  if (local_14 != 0) {
    local_2c = 1;
    iVar1 = setsockopt(local_c,6,1,&local_2c,4);
    if (iVar1 < 0) {
      sbfLog_log(local_8,3,"failed to disabled nagles on tcp-socket");
    }
  }
  local_28 = (sbfTcpConnection_conflict)sbfMemory_calloc(1,0xd0);
  local_28->mLog = local_8;
  local_28->mSocket = local_c;
  local_28->mIsUnix = local_10;
  memcpy(&local_28->mPeer,local_20,0x70);
  return local_28;
}

Assistant:

sbfTcpConnection
sbfTcpConnection_wrap (sbfLog log,
                       int socket,
                       int isUnix,
                       int disableNagles,
                       sbfTcpConnectionAddress* address)
{
    sbfTcpConnection tc;

    evutil_make_socket_closeonexec (socket);
    evutil_make_socket_nonblocking (socket);

    if (disableNagles)
    {
        int flag = 1;
        int result = setsockopt (socket,
                                 IPPROTO_TCP,
                                 TCP_NODELAY,
                                 (char *)&flag,
                                 sizeof (int));
        if (result < 0)
            sbfLog_err (log, "failed to disabled nagles on tcp-socket");
    }

    tc = xcalloc (1, sizeof *tc);
    tc->mLog = log;
    tc->mSocket = socket;
    tc->mIsUnix = isUnix;
    memcpy (&tc->mPeer, address, sizeof(sbfTcpConnectionAddress));

    return tc;
}